

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seq.hpp
# Opt level: O3

Maybe<unsigned_long> __thiscall
rc::Seq<unsigned_long>::SeqImpl<rc::shrink::detail::TowardsSeq<unsigned_long>_>::next
          (SeqImpl<rc::shrink::detail::TowardsSeq<unsigned_long>_> *this)

{
  ulong uVar1;
  undefined1 uVar2;
  long in_RDX;
  ulong uVar3;
  Storage in_RDI;
  Maybe<unsigned_long> MVar4;
  
  uVar1 = (this->m_impl).m_diff;
  if (uVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar3 = -uVar1;
    if ((this->m_impl).m_down == false) {
      uVar3 = uVar1;
    }
    in_RDX = uVar3 + (this->m_impl).m_value;
    (this->m_impl).m_diff = uVar1 >> 1;
    *(long *)in_RDI = in_RDX;
    uVar2 = 1;
  }
  *(undefined1 *)((long)in_RDI + 8) = uVar2;
  MVar4._8_8_ = in_RDX;
  MVar4.m_storage = in_RDI;
  return MVar4;
}

Assistant:

Maybe<T> next() override { return m_impl(); }